

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float64 float64_round_to_int_s390x(float64 a,float_status *s)

{
  FloatParts FVar1;
  
  FVar1._8_8_ = a >> 0x34 & 0x7ff | a >> 0x17 & 0x10000000000;
  FVar1.frac = a & 0xfffffffffffff;
  FVar1 = sf_canonicalize(FVar1,&float64_params,s);
  FVar1 = round_to_int(FVar1,(int)s->float_rounding_mode,0,s);
  FVar1 = round_canonical(FVar1,s,&float64_params);
  return FVar1.frac & 0xfffffffffffff | (FVar1._8_8_ & 0x7ff) << 0x34 |
         (FVar1._8_8_ & 0x10000000000) << 0x17;
}

Assistant:

float64 float64_round_to_int(float64 a, float_status *s)
{
    FloatParts pa = float64_unpack_canonical(a, s);
    FloatParts pr = round_to_int(pa, s->float_rounding_mode, 0, s);
    return float64_round_pack_canonical(pr, s);
}